

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_case.cc
# Opt level: O0

void __thiscall CaseType::GenCleanUpCode(CaseType *this,Output *out_cc,Env *env)

{
  bool bVar1;
  char *pcVar2;
  reference ppCVar3;
  Env *in_RDX;
  Output *in_RSI;
  long in_RDI;
  CaseField *c;
  iterator i;
  vector<CaseField_*,_std::allocator<CaseField_*>_> *in_stack_ffffffffffffffb8;
  Output *this_00;
  Env *in_stack_ffffffffffffffd0;
  Output *in_stack_ffffffffffffffd8;
  __normal_iterator<CaseField_**,_std::vector<CaseField_*,_std::allocator<CaseField_*>_>_>
  in_stack_ffffffffffffffe0;
  
  Type::GenCleanUpCode
            ((Type *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  Env::set_in_branch(in_RDX,true);
  this_00 = in_RSI;
  pcVar2 = Env::RValue(in_RDX,(ID *)in_stack_ffffffffffffffe0._M_current);
  Output::println(this_00,"switch ( %s )",pcVar2);
  Output::inc_indent(in_RSI);
  Output::println(in_RSI,"{");
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    std::vector<CaseField_*,_std::allocator<CaseField_*>_>::begin(in_stack_ffffffffffffffb8);
    while( true ) {
      std::vector<CaseField_*,_std::allocator<CaseField_*>_>::end(in_stack_ffffffffffffffb8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<CaseField_**,_std::vector<CaseField_*,_std::allocator<CaseField_*>_>_>
                          *)this_00,
                         (__normal_iterator<CaseField_**,_std::vector<CaseField_*,_std::allocator<CaseField_*>_>_>
                          *)in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      ppCVar3 = __gnu_cxx::
                __normal_iterator<CaseField_**,_std::vector<CaseField_*,_std::allocator<CaseField_*>_>_>
                ::operator*((__normal_iterator<CaseField_**,_std::vector<CaseField_*,_std::allocator<CaseField_*>_>_>
                             *)&stack0xffffffffffffffe0);
      (*((*ppCVar3)->super_Field).super_DataDepElement._vptr_DataDepElement[9])
                (*ppCVar3,in_RSI,in_RDX);
      __gnu_cxx::
      __normal_iterator<CaseField_**,_std::vector<CaseField_*,_std::allocator<CaseField_*>_>_>::
      operator++((__normal_iterator<CaseField_**,_std::vector<CaseField_*,_std::allocator<CaseField_*>_>_>
                  *)&stack0xffffffffffffffe0);
    }
  }
  Output::println(in_RSI);
  Output::dec_indent(in_RSI);
  Env::set_in_branch(in_RDX,false);
  return;
}

Assistant:

void CaseType::GenCleanUpCode(Output* out_cc, Env* env)
	{
	Type::GenCleanUpCode(out_cc, env);

	env->set_in_branch(true);
	out_cc->println("switch ( %s )", env->RValue(index_var_));
	out_cc->inc_indent();
	out_cc->println("{");
	foreach (i, CaseFieldList, cases_)
		{
		CaseField* c = *i;
		c->GenCleanUpCode(out_cc, env);
		}
	out_cc->println("}");
	out_cc->dec_indent();
	env->set_in_branch(false);
	}